

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateInvocationIdAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  _Rb_tree_color execution_model;
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  StorageClass SVar3;
  _Base_ptr p_Var4;
  list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
  *__position;
  undefined8 *puVar5;
  spv_result_t unaff_EBX;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_color _Var7;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  string local_250;
  _Rb_tree_node_base *local_230;
  string local_228;
  code *local_208;
  undefined8 uStack_200;
  _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  local_1f8;
  BuiltInsValidator *local_c0;
  spv_result_t local_38;
  
  bVar2 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar2) {
    SVar3 = GetStorageClass(referenced_from_inst);
    if ((SVar3 == Input) || (SVar3 == Max)) {
      p_Var4 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var6 = &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var1 = p_Var6;
      if (p_Var4 == p_Var6) {
        bVar2 = true;
      }
      else {
        do {
          local_230 = p_Var1;
          execution_model = p_Var4[1]._M_color;
          _Var7 = execution_model & 0xfffffffd;
          bVar2 = _Var7 == _S_black;
          if (!bVar2) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_208,this->_,SPV_ERROR_INVALID_DATA,
                       referenced_from_inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_278,this->_,0x10a1,(char *)0x0)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,(char *)local_278._M_unused._0_8_,local_278._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "Vulkan spec allows BuiltIn InvocationId to be used only with TessellationControl or Geometry execution models. "
                       ,0x6f);
            (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                      (&local_250,this,decoration,built_in_inst,referenced_inst,referenced_from_inst
                       ,execution_model);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,
                                        (uint32_t)local_250._M_dataplus._M_p),
                       local_250._M_string_length);
            unaff_EBX = local_38;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_250._M_dataplus._M_p._4_4_,(uint32_t)local_250._M_dataplus._M_p)
                != &local_250.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_250._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_250._M_dataplus._M_p),
                              local_250.field_2._M_allocated_capacity + 1);
            }
            if ((code **)local_278._M_unused._0_8_ != &local_268) {
              operator_delete(local_278._M_unused._M_object,(ulong)(local_268 + 1));
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
            p_Var6 = local_230;
          }
        } while ((_Var7 == _S_black) &&
                (p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4), p_Var1 = local_230,
                p_Var4 != p_Var6));
      }
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst)
      ;
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_278,this->_,0x10a2,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,(char *)local_278._M_unused._0_8_,local_278._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,
                 "Vulkan spec allows BuiltIn InvocationId to be only used for variables with Input storage class. "
                 ,0x60);
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_250,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                 ExecutionModelMax);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,
                 (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,
                                  (uint32_t)local_250._M_dataplus._M_p),local_250._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," ",1);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_228,this,referenced_from_inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_250._M_dataplus._M_p._4_4_,(uint32_t)local_250._M_dataplus._M_p) !=
          &local_250.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_250._M_dataplus._M_p._4_4_,
                                 (uint32_t)local_250._M_dataplus._M_p),
                        local_250.field_2._M_allocated_capacity + 1);
      }
      if ((code **)local_278._M_unused._0_8_ != &local_268) {
        operator_delete(local_278._M_unused._M_object,(ulong)(local_268 + 1));
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
      bVar2 = false;
      unaff_EBX = local_38;
    }
    if (!bVar2) {
      return unaff_EBX;
    }
  }
  if (this->function_id_ == 0) {
    local_250._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
    __position = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](&this->id_to_at_reference_checks_,(key_type *)&local_250);
    local_208 = ValidateInvocationIdAtReference;
    uStack_200 = 0;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl(&local_1f8,decoration,built_in_inst,referenced_from_inst,
                  (_Placeholder<1> *)&std::placeholders::_1);
    local_278._M_unused._M_object = (void *)0x0;
    local_278._8_8_ = 0;
    local_268 = (code *)0x0;
    pcStack_260 = (code *)0x0;
    local_c0 = this;
    puVar5 = (undefined8 *)operator_new(0x150);
    *puVar5 = local_208;
    puVar5[1] = uStack_200;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                   *)(puVar5 + 2),&local_1f8);
    puVar5[0x29] = local_c0;
    pcStack_260 = std::
                  _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                  ::_M_invoke;
    local_268 = std::
                _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                ::_M_manager;
    local_278._M_unused._M_object = puVar5;
    std::__cxx11::
    list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
    ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
              (__position,(iterator)__position,
               (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_278);
    if (local_268 != (code *)0x0) {
      (*local_268)(&local_278,&local_278,3);
    }
    if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl
                      .params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateInvocationIdAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4258)
             << "Vulkan spec allows BuiltIn InvocationId to be only used for "
                "variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::TessellationControl &&
          execution_model != spv::ExecutionModel::Geometry) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4257)
               << "Vulkan spec allows BuiltIn InvocationId to be used only "
                  "with TessellationControl or Geometry execution models. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateInvocationIdAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}